

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

void __thiscall ymfm::ym2608::write_address(ym2608 *this,uint8_t data)

{
  uint32_t uVar1;
  uint8_t data_local;
  ym2608 *this_local;
  
  this->m_address = (ushort)data;
  if ((0x2c < this->m_address) && (this->m_address < 0x30)) {
    if (this->m_address == 0x2d) {
      update_prescale(this,'\x06');
    }
    else if ((this->m_address == 0x2e) &&
            (uVar1 = fm_engine_base<ymfm::opn_registers_base<true>_>::clock_prescale
                               ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm),
            uVar1 == 6)) {
      update_prescale(this,'\x03');
    }
    else if (this->m_address == 0x2f) {
      update_prescale(this,'\x02');
    }
  }
  return;
}

Assistant:

void ym2608::write_address(uint8_t data)
{
	// just set the address
	m_address = data;

	// special case: update the prescale
	if (m_address >= 0x2d && m_address <= 0x2f)
	{
		// 2D-2F: prescaler select
		if (m_address == 0x2d)
			update_prescale(6);
		else if (m_address == 0x2e && m_fm.clock_prescale() == 6)
			update_prescale(3);
		else if (m_address == 0x2f)
			update_prescale(2);
	}
}